

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::GenerateBlockSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,GenerateBlockSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_70;
  SyntaxNode *local_60;
  size_t index_local;
  GenerateBlockSyntax *this_local;
  
  switch(index) {
  case 0:
    local_60 = (SyntaxNode *)0x0;
    if (this != (GenerateBlockSyntax *)0xfffffffffffffff0) {
      local_60 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 1:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->label->super_SyntaxNode);
    break;
  case 2:
    token.kind = (this->begin).kind;
    token._2_1_ = (this->begin).field_0x2;
    token.numFlags.raw = (this->begin).numFlags.raw;
    token.rawLen = (this->begin).rawLen;
    token.info = (this->begin).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->beginName->super_SyntaxNode);
    break;
  case 4:
    local_70 = (SyntaxNode *)0x0;
    if (this != (GenerateBlockSyntax *)0xffffffffffffffa0) {
      local_70 = &(this->members).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 5:
    token_00.kind = (this->end).kind;
    token_00._2_1_ = (this->end).field_0x2;
    token_00.numFlags.raw = (this->end).numFlags.raw;
    token_00.rawLen = (this->end).rawLen;
    token_00.info = (this->end).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 6:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->endName->super_SyntaxNode);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax GenerateBlockSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return label;
        case 2: return begin;
        case 3: return beginName;
        case 4: return &members;
        case 5: return end;
        case 6: return endName;
        default: return nullptr;
    }
}